

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_LineEffect
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *activator;
  uint uVar1;
  int iVar2;
  VMValue *pVVar3;
  bool bVar4;
  bool local_fb;
  TFlags<ActorFlag6,_unsigned_int> local_f4;
  int u;
  undefined2 uStack_e8;
  bool res;
  maplinedef_t oldjunk;
  line_t_conflict junk;
  int tag;
  int special;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x149b,
                  "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    activator = *(AActor **)&param->field_0;
    local_fb = true;
    if (activator != (AActor *)0x0) {
      local_fb = DObject::IsKindOf((DObject *)activator,AActor::RegistrationInfo.MyClass);
    }
    if (local_fb != false) {
      if (numparam < 2) {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        if ((pVVar3->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x149c,
                        "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        junk._148_2_ = SUB42((pVVar3->field_0).i,0);
      }
      else {
        if (param[1].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x149c,
                        "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        junk._148_2_ = SUB42(param[1].field_0.i,0);
      }
      if (numparam < 3) {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        if ((pVVar3->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x149d,
                        "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        junk.portalindex._0_2_ = (WORD)(pVVar3->field_0).i;
      }
      else {
        if (param[2].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x149d,
                        "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        junk.portalindex._0_2_ = (WORD)param[2].field_0.i;
      }
      line_t::line_t((line_t *)&oldjunk.special);
      u._1_1_ = 0;
      TFlags<ActorFlag6,_unsigned_int>::operator&
                (&local_f4,
                 (int)activator + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f4);
      if ((uVar1 == 0) && (uStack_e8 = junk._148_2_, junk._148_2_ != 0)) {
        oldjunk.v1 = (WORD)junk.portalindex;
        P_TranslateLineDef((line_t *)&oldjunk.special,(maplinedef_t *)((long)&u + 2),-1);
        iVar2 = P_ExecuteSpecial(junk.flags,(line_t *)0x0,activator,false,junk.activation,
                                 junk.special,junk.args[0],junk.args[1],junk.args[2]);
        u._1_1_ = iVar2 != 0;
        if (((bool)u._1_1_) && ((junk.delta.Y._0_4_ & 0x200) == 0)) {
          TFlags<ActorFlag6,_unsigned_int>::operator|=(&activator->flags6,MF6_LINEDONE);
        }
      }
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x14ae,
                        "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,(uint)(u._1_1_ & 1));
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x149b,
                  "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x149b,
                "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LineEffect)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(special);
	PARAM_INT_DEF(tag);

	line_t junk;
	maplinedef_t oldjunk;
	bool res = false;
	if (!(self->flags6 & MF6_LINEDONE))						// Unless already used up
	{
		if ((oldjunk.special = special))					// Linedef type
		{
			oldjunk.tag = tag;								// Sector tag for linedef
			P_TranslateLineDef(&junk, &oldjunk);			// Turn into native type
			res = !!P_ExecuteSpecial(junk.special, NULL, self, false, junk.args[0], 
				junk.args[1], junk.args[2], junk.args[3], junk.args[4]); 
			if (res && !(junk.flags & ML_REPEAT_SPECIAL))	// If only once,
				self->flags6 |= MF6_LINEDONE;				// no more for this thing
		}
	}
	ACTION_RETURN_BOOL(res);
}